

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cc
# Opt level: O0

void __thiscall
pstack::InflateReader::InflateReader(InflateReader *this,size_t inflatedSize,Reader *upstream)

{
  Reader *len_;
  int iVar1;
  uint uVar2;
  char *data_;
  Exception *pEVar3;
  Exception *pEVar4;
  Reader *things;
  Exception local_8468;
  byte local_82c1;
  long lStack_82c0;
  bool done;
  size_t inputOffset;
  undefined1 local_82b0 [6];
  bool eof;
  undefined4 local_810c;
  uLong *puStack_8108;
  int window;
  z_stream stream;
  char xferbuf [32768];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Reader *local_20;
  Reader *upstream_local;
  size_t inflatedSize_local;
  InflateReader *this_local;
  
  local_20 = upstream;
  upstream_local = (Reader *)inflatedSize;
  inflatedSize_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"inflated content from ",&local_61);
  stringify<pstack::Reader_const&>((string *)(xferbuf + 0x7ff8),(pstack *)local_20,things);
  std::operator+(&local_40,&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (xferbuf + 0x7ff8));
  len_ = upstream_local;
  data_ = (char *)operator_new__((ulong)upstream_local);
  MemReader::MemReader(&this->super_MemReader,&local_40,(size_t)len_,data_);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)(xferbuf + 0x7ff8));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  (this->super_MemReader).super_Reader._vptr_Reader = (_func_int **)&PTR__InflateReader_002f2af0;
  stream.data_type = 0;
  stream._92_4_ = 0;
  stream.adler = 0;
  stream.zfree = (free_func)0x0;
  stream.opaque = (voidpf)0x0;
  stream.state = (internal_state *)0x0;
  stream.zalloc = (alloc_func)0x0;
  stream.total_out = 0;
  stream.msg = (char *)0x0;
  stream.next_out = (Bytef *)0x0;
  stream.avail_out = 0;
  stream._36_4_ = 0;
  stream.avail_in = 0;
  stream._12_4_ = 0;
  stream.total_in = 0;
  puStack_8108 = (uLong *)0x0;
  stream.next_in = (Bytef *)0x0;
  local_810c = 0xf;
  iVar1 = inflateInit2_(&stack0xffffffffffff7ef8,0xf,"1.2.11",0x70);
  if (iVar1 != 0) {
    inputOffset._7_1_ = 1;
    pEVar3 = (Exception *)__cxa_allocate_exception();
    memset((Exception *)local_82b0,0,0x1a0);
    Exception::Exception((Exception *)local_82b0);
    pEVar4 = Exception::operator<<((Exception *)local_82b0,(char (*) [20])"inflateInit2 failed");
    Exception::Exception(pEVar3,pEVar4);
    inputOffset._7_1_ = 0;
    __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
  }
  stream.next_out = (Bytef *)CONCAT44(stream.next_out._4_4_,(int)upstream_local);
  stream.total_in = (uLong)(this->super_MemReader).data;
  inputOffset._6_1_ = 0;
  lStack_82c0 = 0;
  local_82c1 = 0;
  while( true ) {
    do {
      if (((local_82c1 ^ 0xff) & 1) == 0) {
        inflateEnd(&stack0xffffffffffff7ef8);
        return;
      }
      if (((int)stream.next_in == 0) && ((inputOffset._6_1_ & 1) == 0)) {
        uVar2 = (*local_20->_vptr_Reader[2])(local_20,lStack_82c0,0x8000,&stream.reserved);
        stream.next_in = (Bytef *)CONCAT44(stream.next_in._4_4_,uVar2);
        lStack_82c0 = (ulong)uVar2 + lStack_82c0;
        puStack_8108 = &stream.reserved;
        if (uVar2 == 0) {
          inputOffset._6_1_ = 1;
        }
      }
      iVar1 = inflate(&stack0xffffffffffff7ef8);
    } while (iVar1 == 0);
    if (iVar1 != 1) break;
    local_82c1 = 1;
  }
  pEVar3 = (Exception *)__cxa_allocate_exception();
  memset(&local_8468,0,0x1a0);
  Exception::Exception(&local_8468);
  pEVar4 = Exception::operator<<(&local_8468,(char (*) [15])"inflate failed");
  Exception::Exception(pEVar3,pEVar4);
  __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

InflateReader::InflateReader(size_t inflatedSize, const Reader &upstream)
    : MemReader(std::string("inflated content from ") + stringify(upstream),
          inflatedSize, new char[inflatedSize])
{
    char xferbuf[32768];

    z_stream stream{};

    int window = 15;
    if (inflateInit2(&stream, window) != Z_OK)
        throw (Exception() << "inflateInit2 failed");

    stream.avail_out = inflatedSize;
    using bytep = Bytef *;
    stream.next_out = bytep(data);
    bool eof = false;
    size_t inputOffset = 0;
    for (bool done = false; !done; ) {
        if (stream.avail_in == 0 && !eof) {
            // keep the input buffer full
            stream.avail_in = upstream.read(inputOffset, sizeof xferbuf, xferbuf);
            inputOffset += stream.avail_in;
            stream.next_in = bytep(xferbuf);
            if (stream.avail_in == 0)
                eof = true;
        }
        switch (inflate(&stream, eof ? Z_FINISH : Z_SYNC_FLUSH)) {
            case Z_STREAM_END:
                done = true;
                // fallthrough
            case Z_OK:
                break;
            default:
                throw (Exception() << "inflate failed");
        }
    }
    inflateEnd(&stream);
}